

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int64_t av1_rd_pick_intra_sbuv_mode
                  (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
                  uint8_t *skippable,BLOCK_SIZE bsize,TX_SIZE max_tx_size)

{
  byte mode;
  long lVar1;
  long lVar2;
  byte bVar3;
  PREDICTION_MODE mode_00;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined1 *in_R9;
  bool bVar8;
  byte in_stack_00000010;
  uint8_t *best_palette_color_map;
  int try_palette;
  int mode_cost;
  int rate_overhead;
  int is_intra_frame;
  int is_chroma;
  TX_SIZE uv_tx_size;
  SPEED_FEATURES *sf;
  int is_directional_mode;
  int is_diagonal_mode;
  PREDICTION_MODE intra_mode;
  int mode_rate;
  UV_PREDICTION_MODE uv_mode;
  RD_STATS tokenonly_rd_stats;
  int this_rate;
  int mode_idx;
  CFL_ALLOWED_TYPE cfl_allowed;
  IntraModeSearchState intra_search_state;
  IntraModeCfg *intra_mode_cfg;
  ModeCosts *mode_costs;
  int64_t this_rd;
  int64_t best_rd;
  MB_MODE_INFO best_mbmi;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  RD_STATS *in_stack_000008b0;
  int in_stack_000008bc;
  int64_t in_stack_000008c0;
  TX_SIZE in_stack_000008cf;
  AV1_COMP *in_stack_000008d0;
  MACROBLOCK *in_stack_000008d8;
  uint8_t *in_stack_000008f0;
  int8_t *in_stack_000008f8;
  int64_t *in_stack_00004758;
  MB_MODE_INFO *in_stack_00004760;
  uint8_t *in_stack_00004768;
  int in_stack_00004774;
  MACROBLOCK *in_stack_00004778;
  AV1_COMP *in_stack_00004780;
  int *in_stack_00004790;
  int *in_stack_00004798;
  int64_t *in_stack_000047a0;
  uint8_t *in_stack_000047a8;
  uint8_t *in_stack_fffffffffffffdc8;
  MACROBLOCK *in_stack_fffffffffffffdd0;
  AV1_COMP *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  MACROBLOCKD *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffe38;
  BLOCK_SIZE in_stack_fffffffffffffe3f;
  MB_MODE_INFO *in_stack_fffffffffffffe40;
  MACROBLOCK *in_stack_fffffffffffffe48;
  AV1_COMP *in_stack_fffffffffffffe50;
  undefined1 local_1a8;
  int local_198;
  TRELLIS_OPT_TYPE in_stack_fffffffffffffe6e;
  RUN_TYPE in_stack_fffffffffffffe6f;
  int in_stack_fffffffffffffe70;
  BLOCK_SIZE in_stack_fffffffffffffe77;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  undefined7 in_stack_fffffffffffffe80;
  BLOCK_SIZE in_stack_fffffffffffffe87;
  float in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8c;
  BLOCK_SIZE in_stack_fffffffffffffe8e;
  BLOCK_SIZE in_stack_fffffffffffffe8f;
  MACROBLOCK *in_stack_fffffffffffffe90;
  AV1_COMP *in_stack_fffffffffffffe98;
  RD_STATS *in_stack_fffffffffffffeb0;
  long local_110;
  undefined1 local_108 [176];
  MB_MODE_INFO *local_58;
  long local_50;
  AV1_COMMON *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  int *local_30;
  int *local_28;
  long local_20;
  long local_18;
  int64_t local_10;
  
  local_48 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_50 = in_RSI + 0x1a0;
  local_58 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x2058);
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  memcpy(local_108,local_58,0xb0);
  lVar2 = local_18;
  lVar1 = local_20;
  local_110 = 0x7fffffffffffffff;
  init_sbuv_mode(local_58);
  if ((*(byte *)(local_50 + 0xc) & 1) == 0) {
    *local_28 = 0;
    *local_30 = 0;
    *local_38 = 0;
    *local_40 = 1;
    local_10 = 0x7fffffffffffffff;
  }
  else {
    bVar3 = store_cfl_required_rdo
                      ((AV1_COMMON *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    *(uint *)(local_50 + 0x3ab0) = (uint)bVar3;
    if (*(int *)(local_50 + 0x3ab0) != 0) {
      av1_encode_intra_block_plane
                ((AV1_COMP *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 in_stack_fffffffffffffe77,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6f,
                 in_stack_fffffffffffffe6e);
      *(undefined4 *)(local_50 + 0x3ab0) = 0;
    }
    init_intra_mode_search_state((IntraModeSearchState *)0x34b85c);
    bVar3 = is_cfl_allowed(in_stack_fffffffffffffde8);
    for (local_198 = 0; local_198 < 0xe; local_198 = local_198 + 1) {
      mode = ""[local_198];
      if ((long)*(int *)(lVar1 + 0x6874 + (ulong)bVar3 * 0x2d8 + (ulong)local_58->mode * 0x38 +
                        (ulong)mode * 4) * (long)*(int *)(local_20 + 0x4218) + 0x100 >> 9 <=
          local_110) {
        mode_00 = get_uv_mode(mode);
        iVar5 = av1_is_diagonal_mode(mode_00);
        iVar6 = av1_is_directional_mode(mode_00);
        lVar7 = local_18;
        if ((((iVar5 == 0) || ((*(byte *)(local_18 + 0x426ed) & 1) != 0)) &&
            ((iVar6 == 0 || ((*(byte *)(local_18 + 0x426ec) & 1) != 0)))) &&
           (((*(uint *)(local_18 + 0x60b70 + (ulong)""[in_stack_00000010] * 4) & 1 << (mode & 0x1f))
             != 0 && ((((((*(byte *)(lVar2 + 0x426e9) & 1) != 0 || (mode < 9)) || (0xb < mode)) &&
                       (((*(byte *)(lVar2 + 0x426ea) & 1) != 0 || (mode != 0xc)))) &&
                      ((*(int *)(local_18 + 0x60ba4) == 0 ||
                       (((uint)av1_derived_chroma_intra_mode_used_flag[local_58->mode] &
                        1 << (mode & 0x1f)) != 0)))))))) {
          local_58->uv_mode = mode;
          local_58->angle_delta[1] = '\0';
          if (mode == 0xd) {
            if ((bVar3 != 0) && ((*(byte *)(lVar2 + 0x426eb) & 1) != 0)) {
              av1_get_tx_size((int)in_stack_fffffffffffffde0,
                              (MACROBLOCKD *)in_stack_fffffffffffffdd8);
              in_stack_fffffffffffffdc8 = &local_58->cfl_alpha_idx;
              in_stack_fffffffffffffdd0 = (MACROBLOCK *)&local_58->cfl_alpha_signs;
              iVar6 = cfl_rd_pick_alpha(in_stack_000008d8,in_stack_000008d0,in_stack_000008cf,
                                        in_stack_000008c0,in_stack_000008bc,in_stack_000008b0,
                                        in_stack_000008f0,in_stack_000008f8);
              iVar5 = in_stack_fffffffffffffe38;
              goto joined_r0x0034bcee;
            }
          }
          else if (((iVar6 == 0) || (iVar5 = av1_use_angle_delta(local_58->bsize), iVar5 == 0)) ||
                  ((*(byte *)(lVar2 + 0x426ee) & 1) == 0)) {
            if ((mode != 9) ||
               (_Var4 = should_prune_chroma_smooth_pred_based_on_source_variance
                                  (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                                   (BLOCK_SIZE)((ulong)in_stack_fffffffffffffdc8 >> 0x38)), !_Var4))
            {
              iVar6 = av1_txfm_uvrd(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                    (RD_STATS *)
                                    CONCAT17(in_stack_fffffffffffffe8f,
                                             CONCAT16(in_stack_fffffffffffffe8e,
                                                      CONCAT24(in_stack_fffffffffffffe8c,
                                                               in_stack_fffffffffffffe88))),
                                    in_stack_fffffffffffffe87,
                                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
              iVar5 = in_stack_fffffffffffffe38;
              goto joined_r0x0034bcee;
            }
          }
          else {
            if ((*(int *)(lVar7 + 0x60b8c) != 0) && (in_stack_fffffffffffffe88 == 0.0)) {
              frame_is_intra_only(local_48);
              prune_intra_mode_with_hog
                        (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f,
                         in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88,
                         (uint8_t *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                         in_stack_fffffffffffffe7c);
              in_stack_fffffffffffffe88 = 1.4013e-45;
            }
            if ((&stack0xfffffffffffffe78)[mode] == '\0') {
              in_stack_fffffffffffffdc8 = &stack0xfffffffffffffe38;
              iVar6 = rd_pick_intra_angle_sbuv
                                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                 in_stack_fffffffffffffe8f,(int)in_stack_fffffffffffffe88,
                                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                                 (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ),in_stack_fffffffffffffeb0);
              iVar5 = in_stack_fffffffffffffe38;
joined_r0x0034bcee:
              in_stack_fffffffffffffe38 = iVar5;
              if (iVar6 != 0) {
                iVar6 = intra_mode_info_cost_uv
                                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                                   in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,iVar5);
                lVar7 = ((long)(iVar5 + iVar6) * (long)*(int *)(local_20 + 0x4218) + 0x100 >> 9) +
                        (long)in_stack_fffffffffffffe40 * 0x80;
                if (lVar7 < local_110) {
                  memcpy(local_108,local_58,0xb0);
                  *local_28 = iVar5 + iVar6;
                  *local_30 = in_stack_fffffffffffffe38;
                  *local_38 = in_stack_fffffffffffffe40;
                  *local_40 = local_1a8;
                  local_110 = lVar7;
                }
              }
            }
          }
        }
      }
    }
    bVar8 = false;
    if ((*(byte *)(local_18 + 0x4244c) & 1) != 0) {
      iVar5 = av1_allow_palette((uint)(*(byte *)(local_18 + 0x3c16f) & 1),local_58->bsize);
      bVar8 = iVar5 != 0;
    }
    if (bVar8) {
      av1_rd_pick_palette_intra_sbuv
                (in_stack_00004780,in_stack_00004778,in_stack_00004774,in_stack_00004768,
                 in_stack_00004760,in_stack_00004758,in_stack_00004790,in_stack_00004798,
                 in_stack_000047a0,in_stack_000047a8);
    }
    memcpy(local_58,local_108,0xb0);
    local_10 = local_110;
  }
  return local_10;
}

Assistant:

int64_t av1_rd_pick_intra_sbuv_mode(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    int *rate, int *rate_tokenonly,
                                    int64_t *distortion, uint8_t *skippable,
                                    BLOCK_SIZE bsize, TX_SIZE max_tx_size) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  MB_MODE_INFO best_mbmi = *mbmi;
  int64_t best_rd = INT64_MAX, this_rd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;

  init_sbuv_mode(mbmi);

  // Return if the current block does not correspond to a chroma block.
  if (!xd->is_chroma_ref) {
    *rate = 0;
    *rate_tokenonly = 0;
    *distortion = 0;
    *skippable = 1;
    return INT64_MAX;
  }

  // Only store reconstructed luma when there's chroma RDO. When there's no
  // chroma RDO, the reconstructed luma will be stored in encode_superblock().
  xd->cfl.store_y = store_cfl_required_rdo(cm, x);
  if (xd->cfl.store_y) {
    // Restore reconstructed luma values.
    // TODO(chiyotsai@google.com): right now we are re-computing the txfm in
    // this function everytime we search through uv modes. There is some
    // potential speed up here if we cache the result to avoid redundant
    // computation.
    av1_encode_intra_block_plane(cpi, x, mbmi->bsize, AOM_PLANE_Y,
                                 DRY_RUN_NORMAL,
                                 cpi->optimize_seg_arr[mbmi->segment_id]);
    xd->cfl.store_y = 0;
  }
  IntraModeSearchState intra_search_state;
  init_intra_mode_search_state(&intra_search_state);
  const CFL_ALLOWED_TYPE cfl_allowed = is_cfl_allowed(xd);

  // Search through all non-palette modes.
  for (int mode_idx = 0; mode_idx < UV_INTRA_MODES; ++mode_idx) {
    int this_rate;
    RD_STATS tokenonly_rd_stats;
    UV_PREDICTION_MODE uv_mode = uv_rd_search_mode_order[mode_idx];

    // Skip the current mode evaluation if the RD cost derived using the mode
    // signaling rate exceeds the best_rd so far.
    const int mode_rate =
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
    if (RDCOST(x->rdmult, mode_rate, 0) > best_rd) continue;

    PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
    const int is_diagonal_mode = av1_is_diagonal_mode(intra_mode);
    const int is_directional_mode = av1_is_directional_mode(intra_mode);

    if (is_diagonal_mode && !cpi->oxcf.intra_mode_cfg.enable_diagonal_intra)
      continue;
    if (is_directional_mode &&
        !cpi->oxcf.intra_mode_cfg.enable_directional_intra)
      continue;

    if (!(cpi->sf.intra_sf.intra_uv_mode_mask[txsize_sqr_up_map[max_tx_size]] &
          (1 << uv_mode)))
      continue;
    if (!intra_mode_cfg->enable_smooth_intra && uv_mode >= UV_SMOOTH_PRED &&
        uv_mode <= UV_SMOOTH_H_PRED)
      continue;

    if (!intra_mode_cfg->enable_paeth_intra && uv_mode == UV_PAETH_PRED)
      continue;

    assert(mbmi->mode < INTRA_MODES);
    if (cpi->sf.intra_sf.prune_chroma_modes_using_luma_winner &&
        !(av1_derived_chroma_intra_mode_used_flag[mbmi->mode] & (1 << uv_mode)))
      continue;

    mbmi->uv_mode = uv_mode;

    // Init variables for cfl and angle delta
    const SPEED_FEATURES *sf = &cpi->sf;
    mbmi->angle_delta[PLANE_TYPE_UV] = 0;
    if (uv_mode == UV_CFL_PRED) {
      if (!cfl_allowed || !intra_mode_cfg->enable_cfl_intra) continue;
      assert(!is_directional_mode);
      const TX_SIZE uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
      if (!cfl_rd_pick_alpha(x, cpi, uv_tx_size, best_rd,
                             sf->intra_sf.cfl_search_range, &tokenonly_rd_stats,
                             &mbmi->cfl_alpha_idx, &mbmi->cfl_alpha_signs)) {
        continue;
      }
    } else if (is_directional_mode && av1_use_angle_delta(mbmi->bsize) &&
               intra_mode_cfg->enable_angle_delta) {
      if (sf->intra_sf.chroma_intra_pruning_with_hog &&
          !intra_search_state.dir_mode_skip_mask_ready) {
        static const float thresh[2][4] = {
          { -1.2f, 0.0f, 0.0f, 1.2f },    // Interframe
          { -1.2f, -1.2f, -0.6f, 0.4f },  // Intraframe
        };
        const int is_chroma = 1;
        const int is_intra_frame = frame_is_intra_only(cm);
        prune_intra_mode_with_hog(
            x, bsize, cm->seq_params->sb_size,
            thresh[is_intra_frame]
                  [sf->intra_sf.chroma_intra_pruning_with_hog - 1],
            intra_search_state.directional_mode_skip_mask, is_chroma);
        intra_search_state.dir_mode_skip_mask_ready = 1;
      }
      if (intra_search_state.directional_mode_skip_mask[uv_mode]) {
        continue;
      }

      // Search through angle delta
      const int rate_overhead =
          mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
      if (!rd_pick_intra_angle_sbuv(cpi, x, bsize, rate_overhead, best_rd,
                                    &this_rate, &tokenonly_rd_stats))
        continue;
    } else {
      if (uv_mode == UV_SMOOTH_PRED &&
          should_prune_chroma_smooth_pred_based_on_source_variance(cpi, x,
                                                                   bsize))
        continue;

      // Predict directly if we don't need to search for angle delta.
      if (!av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, best_rd)) {
        continue;
      }
    }
    const int mode_cost =
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
    this_rate = tokenonly_rd_stats.rate +
                intra_mode_info_cost_uv(cpi, x, mbmi, bsize, mode_cost);
    this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);

    if (this_rd < best_rd) {
      best_mbmi = *mbmi;
      best_rd = this_rd;
      *rate = this_rate;
      *rate_tokenonly = tokenonly_rd_stats.rate;
      *distortion = tokenonly_rd_stats.dist;
      *skippable = tokenonly_rd_stats.skip_txfm;
    }
  }

  // Search palette mode
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mbmi->bsize);
  if (try_palette) {
    uint8_t *best_palette_color_map = x->palette_buffer->best_palette_color_map;
    av1_rd_pick_palette_intra_sbuv(
        cpi, x,
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][UV_DC_PRED],
        best_palette_color_map, &best_mbmi, &best_rd, rate, rate_tokenonly,
        distortion, skippable);
  }

  *mbmi = best_mbmi;
  // Make sure we actually chose a mode
  assert(best_rd < INT64_MAX);
  return best_rd;
}